

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall
flow::UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2>::UnaryInstr
          (UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *this,Value *op,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_51;
  Value *local_50;
  iterator local_48;
  size_type local_40;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_38;
  string *local_20;
  string *name_local;
  Value *op_local;
  UnaryInstr<(flow::UnaryOperator)1,_(flow::LiteralType)2> *this_local;
  
  local_48 = &local_50;
  local_40 = 1;
  local_50 = op;
  local_20 = name;
  name_local = (string *)op;
  op_local = (Value *)this;
  std::allocator<flow::Value_*>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_38,__l,&local_51);
  Instr::Instr(&this->super_Instr,Number,&local_38,local_20);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_38);
  std::allocator<flow::Value_*>::~allocator(&local_51);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__UnaryInstr_002ca4c0;
  this->operator_ = INot;
  return;
}

Assistant:

UnaryInstr(Value* op, const std::string& name)
      : Instr(ResultType, {op}, name), operator_(Operator) {}